

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BPlusTree.h
# Opt level: O1

void __thiscall
BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
::loose_insert(BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               *this,Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                     *entry)

{
  Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  *data;
  bool bVar1;
  int index;
  Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *pPVar2
  ;
  BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
  **ppBVar3;
  size_t index_00;
  
  pPVar2 = find(this,entry);
  if (pPVar2 == (Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
                 *)0x0) {
    data = &this->data;
    index = b_array::first_ge<Map::Pair<std::__cxx11::string,int>>(data,this->data_size,entry);
    index_00 = (size_t)index;
    if (this->subset_size != 0) {
      pPVar2 = b_array::
               Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator[](data,index_00);
      bVar1 = Map::operator!=(pPVar2,entry);
      if (bVar1) {
        ppBVar3 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_*>
                  ::operator[](&this->subset,index_00);
        loose_insert(*ppBVar3,entry);
        ppBVar3 = b_array::
                  Array<BPlusTree<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_*>
                  ::operator[](&this->subset,index_00);
        if ((*ppBVar3)->data_size < 3) {
          return;
        }
        fix_excess(this,index);
        return;
      }
    }
    pPVar2 = b_array::
             Array<Map::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator[](data,index_00);
    bVar1 = Map::operator!=(pPVar2,entry);
    if (bVar1) {
      b_array::insert_item<Map::Pair<std::__cxx11::string,int>>
                (data,index_00,&this->data_size,entry);
      return;
    }
  }
  else if (this->duplicates_allowed == false) {
    std::__cxx11::string::_M_assign((string *)pPVar2);
    pPVar2->value = entry->value;
  }
  return;
}

Assistant:

void BPlusTree<T>::loose_insert(const T& entry) {
    // check if thing is already here
    T* item = find(entry);
    // assuming the duplicates allowed flag is for multimap to call +=
    if (item != nullptr) {
        if (!duplicates_allowed)
            *item = entry;
        else
            *item += entry;
        return;
    }
    
    // it's not here, put it somewhere
    int index = b_array::first_ge(data, data_size, entry);
    if (!is_leaf() && data[index] != entry)
        subset[index]->loose_insert(entry);
    else {
        if (data[index] != entry)
            b_array::insert_item(data, index, data_size, entry);
        return;
    }
    if (subset[index]->data_size > MAXIMUM) {
        fix_excess(index);
    }
}